

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O1

int __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>::ClassId
          (TPZGeoElRefLess<pzgeom::TPZQuadraticTetra> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string local_98;
  TPZQuadraticTetra local_78;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"TPZGeoElRefLess","");
  uVar1 = Hash(&local_98);
  iVar2 = TPZGeoEl::ClassId(&this->super_TPZGeoEl);
  local_78.super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes[0]._0_4_ = 0xffffffff;
  local_78.super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes[0]._4_4_ = 0xffffffff;
  local_78.super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes[1]._0_4_ = 0xffffffff;
  local_78.super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes[1]._4_4_ = 0xffffffff;
  local_78.super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes[2]._0_4_ = 0xffffffff;
  local_78.super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes[2]._4_4_ = 0xffffffff;
  local_78.super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes[3]._0_4_ = 0xffffffff;
  local_78.super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes[3]._4_4_ = 0xffffffff;
  local_78.super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes[4]._0_4_ = 0xffffffff;
  local_78.super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes[4]._4_4_ = 0xffffffff;
  local_78.super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes[5]._0_4_ = 0xffffffff;
  local_78.super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes[5]._4_4_ = 0xffffffff;
  local_78.super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes[6]._0_4_ = 0xffffffff;
  local_78.super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes[6]._4_4_ = 0xffffffff;
  local_78.super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes[7]._0_4_ = 0xffffffff;
  local_78.super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes[7]._4_4_ = 0xffffffff;
  local_78.super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes[8]._0_4_ = 0xffffffff;
  local_78.super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes[8]._4_4_ = 0xffffffff;
  local_78.super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes[9]._0_4_ = 0xffffffff;
  local_78.super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes[9]._4_4_ = 0xffffffff;
  local_78.super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.super_TPZTetrahedron.super_TPZSavable.
  _vptr_TPZSavable = (TPZSavable)&PTR__TPZQuadraticTetra_018dc9f8;
  iVar3 = pzgeom::TPZQuadraticTetra::ClassId(&local_78);
  pzgeom::TPZQuadraticTetra::~TPZQuadraticTetra(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}